

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::eval_const_subscript(CTcPrsNode *lhs,CTcPrsNode *subscript)

{
  uint uVar1;
  CTPNListBase *this;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  CTcPrsNode *pCVar3;
  
  iVar2 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    return (CTcPrsNode *)0x0;
  }
  iVar2 = (*(subscript->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subscript);
  if (CONCAT44(extraout_var_00,iVar2) == 0) {
    return (CTcPrsNode *)0x0;
  }
  iVar2 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(lhs);
  uVar1 = *(uint *)CONCAT44(extraout_var_01,iVar2);
  if (uVar1 < 0xe) {
    if ((0x2a90U >> (uVar1 & 0x1f) & 1) != 0) {
      return (CTcPrsNode *)0x0;
    }
    if (uVar1 == 6) {
      iVar2 = (*(subscript->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subscript);
      if (*(int *)CONCAT44(extraout_var_02,iVar2) == 3) {
        iVar2 = (*(lhs->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(lhs);
        this = *(CTPNListBase **)(CONCAT44(extraout_var_03,iVar2) + 8);
        iVar2 = (*(subscript->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subscript);
        pCVar3 = CTPNListBase::get_const_ele(this,*(int *)(CONCAT44(extraout_var_04,iVar2) + 8));
        return pCVar3;
      }
      iVar2 = 0x2b0f;
      goto LAB_0022ebf6;
    }
  }
  iVar2 = 0x2bbe;
LAB_0022ebf6:
  CTcTokenizer::log_error(iVar2);
  return (CTcPrsNode *)0x0;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::eval_const_subscript(
    CTcPrsNode *lhs, CTcPrsNode *subscript)
{
    /* assume we won't be able to evaluate this as a constant */
    CTcPrsNode *c = 0;

    /* 
     *   if we're subscripting a constant list by a constant index value,
     *   we can evaluate a constant result 
     */
    if (lhs->is_const() && subscript->is_const())
    {
        /* check the type of value we're indexing */
        switch (lhs->get_const_val()->get_type())
        {
        case TC_CVT_LIST:
            /* 
             *   It's a constant list.  Lists can only be indexed by integer
             *   values. 
             */
            if (subscript->get_const_val()->get_type() == TC_CVT_INT)
            {
                /* 
                 *   it's an integer - index the constant list by the
                 *   constant subscript to get the element value, which
                 *   replaces the entire list-and-index expression
                 */
                c = lhs->get_const_val()->get_val_list()->get_const_ele(
                    subscript->get_const_val()->get_val_int());
            }
            else
            {
                /* a list index must be an integer */
                G_tok->log_error(TCERR_CONST_IDX_NOT_INT);
            }
            break;

        case TC_CVT_SSTR:
        case TC_CVT_OBJ:
        case TC_CVT_FUNCPTR:
        case TC_CVT_ANONFUNCPTR:
        case TC_CVT_FLOAT:
            /* 
             *   these types don't define indexing as a native operator, but
             *   it's possible for this to be meaningful at run-time via
             *   operator overloading; simply leave the constant expression
             *   unevaluated so that we generate code to perform the index
             *   operation at run-time 
             */
            break;
            
        default:
            /* other types definitely cannot be indexed */
            G_tok->log_error(TCERR_CONST_IDX_INV_TYPE);
            break;
        }
    }
    
    /* return the constant result, if any */
    return c;
}